

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm.c
# Opt level: O0

void CMWriteQueuedData(transport_entry_conflict trans,CMConnection conn)

{
  int iVar1;
  __pid_t _Var2;
  long lVar3;
  pthread_t pVar4;
  long *in_RSI;
  long in_RDI;
  CMConnection in_stack_00000020;
  timespec ts_5;
  timespec ts_4;
  timespec ts_3;
  int i;
  ssize_t actual_2;
  FFSEncodeVector vec;
  size_t length;
  size_t vec_count;
  timespec ts_2;
  ssize_t actual_1;
  FFSEncodeVec tmp_vec_1 [1];
  timespec ts_1;
  ssize_t actual;
  FFSEncodeVec tmp_vec [1];
  timespec ts;
  attr_list attrs;
  undefined8 in_stack_ffffffffffffff08;
  FILE *pFVar5;
  CMTraceType trace_type;
  CManager in_stack_ffffffffffffff10;
  FILE *in_stack_ffffffffffffff18;
  CManager_conflict in_stack_ffffffffffffff20;
  timespec local_d8;
  timespec local_c8;
  timespec local_b8;
  int local_a4;
  long local_a0;
  long local_98;
  long local_90;
  long local_88;
  timespec local_80;
  long local_70;
  long local_68;
  long local_60;
  timespec local_50;
  long local_40;
  long *local_38;
  long local_30;
  timespec local_28;
  undefined8 local_18;
  long *local_10;
  long local_8;
  
  trace_type = (CMTraceType)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  local_18 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  if (*(long *)(*in_RSI + 0x120) == 0) {
    iVar1 = CMtrace_init(in_stack_ffffffffffffff10,trace_type);
    if (iVar1 != 0) {
LAB_00124328:
      if (CMtrace_PID != 0) {
        in_stack_ffffffffffffff18 = *(FILE **)(*local_10 + 0x120);
        _Var2 = getpid();
        in_stack_ffffffffffffff20 = (CManager_conflict)(long)_Var2;
        pVar4 = pthread_self();
        fprintf(in_stack_ffffffffffffff18,"P%lxT%lx - ",in_stack_ffffffffffffff20,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_28);
        fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",local_28.tv_sec,local_28.tv_nsec);
      }
      fprintf(*(FILE **)(*local_10 + 0x120),"CMWriteQueuedData, conn %p, header %zd, attr %zd\n",
              local_10,local_10[0x1f],local_10[0x21]);
    }
  }
  else if (CMtrace_val[3] != 0) goto LAB_00124328;
  fflush(*(FILE **)(*local_10 + 0x120));
  if (local_10[0x1f] == 0) {
LAB_0012467f:
    if (local_10[0x21] != 0) {
      local_68 = local_10[0x20];
      local_60 = local_10[0x21];
      iVar1 = (**(code **)(local_8 + 0x80))(&CMstatic_trans_svcs,local_10[2],&local_68,1,local_18);
      local_70 = (long)iVar1;
      if (local_70 == -1) goto LAB_00124def;
      if (local_70 < local_10[0x21]) {
        local_10[0x21] = local_10[0x21] - local_70;
        local_10[0x20] = local_70 + local_10[0x20];
        iVar1 = CMtrace_val[3];
        if (*(long *)(*local_10 + 0x120) == 0) {
          iVar1 = CMtrace_init(in_stack_ffffffffffffff10,trace_type);
        }
        if (iVar1 != 0) {
          if (CMtrace_PID != 0) {
            pFVar5 = *(FILE **)(*local_10 + 0x120);
            _Var2 = getpid();
            pVar4 = pthread_self();
            fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar4);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_80);
            fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",local_80.tv_sec,local_80.tv_nsec);
          }
          fprintf(*(FILE **)(*local_10 + 0x120),"CMWriteQueuedData, conn %p, remaining attr %zd\n",
                  local_10,local_10[0x21]);
        }
        fflush(*(FILE **)(*local_10 + 0x120));
        return;
      }
    }
    if (local_10[0x22] != 0) {
      local_88 = 0;
      local_90 = 0;
      local_98 = local_10[0x22];
      local_a0 = 0;
      for (; *(long *)(local_98 + local_88 * 0x10) != 0; local_88 = local_88 + 1) {
        local_90 = *(long *)(local_98 + local_88 * 0x10 + 8) + local_90;
      }
      iVar1 = (**(code **)(local_8 + 0x80))
                        (&CMstatic_trans_svcs,local_10[2],local_98,local_88,local_18);
      local_a0 = (long)iVar1;
      if (local_a0 == -1) {
        local_a0 = -1;
        goto LAB_00124def;
      }
      if (local_a0 < local_90) {
        local_a4 = 0;
        iVar1 = CMtrace_val[3];
        if (*(long *)(*local_10 + 0x120) == 0) {
          iVar1 = CMtrace_init(in_stack_ffffffffffffff10,trace_type);
        }
        if (iVar1 != 0) {
          if (CMtrace_PID != 0) {
            pFVar5 = *(FILE **)(*local_10 + 0x120);
            _Var2 = getpid();
            pVar4 = pthread_self();
            fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar4);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_b8);
            fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",local_b8.tv_sec,local_b8.tv_nsec);
          }
          fprintf(*(FILE **)(*local_10 + 0x120),"Continued partial pending write, %zu bytes sent\n",
                  local_a0);
        }
        fflush(*(FILE **)(*local_10 + 0x120));
        for (; *(long *)(local_98 + (long)local_a4 * 0x10 + 8) < local_a0;
            local_a0 = local_a0 - *(long *)(local_98 + lVar3 * 0x10 + 8)) {
          lVar3 = (long)local_a4;
          local_a4 = local_a4 + 1;
          local_88 = local_88 + -1;
        }
        lVar3 = local_98 + (long)local_a4 * 0x10;
        *(long *)(lVar3 + 8) = *(long *)(lVar3 + 8) - local_a0;
        *(long *)(local_98 + (long)local_a4 * 0x10) =
             *(long *)(local_98 + (long)local_a4 * 0x10) + local_a0;
        local_10[0x22] = local_98 + (long)local_a4 * 0x10;
        iVar1 = CMtrace_val[3];
        if (*(long *)(*local_10 + 0x120) == 0) {
          iVar1 = CMtrace_init(in_stack_ffffffffffffff10,trace_type);
        }
        if (iVar1 != 0) {
          if (CMtrace_PID != 0) {
            pFVar5 = *(FILE **)(*local_10 + 0x120);
            _Var2 = getpid();
            pVar4 = pthread_self();
            fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar4);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_c8);
            fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",local_c8.tv_sec,local_c8.tv_nsec);
          }
          fprintf(*(FILE **)(*local_10 + 0x120),
                  "CMWriteQueuedData, conn %p, %zu remaining data vectors\n",local_10,local_88);
        }
        fflush(*(FILE **)(*local_10 + 0x120));
        return;
      }
    }
    if (local_10[0x23] != 0) {
      cm_return_data_buf(in_stack_ffffffffffffff20,(CMbuffer)in_stack_ffffffffffffff18);
    }
    *(undefined4 *)(local_10 + 0x24) = 0;
    (**(code **)(local_10[1] + 0x90))(local_10[1],&CMstatic_trans_svcs,local_10[2],0);
    iVar1 = CManager_locked((CManager)*local_10);
    if (iVar1 == 0) {
      printf("Not LOCKED in write queued data!\n");
    }
    cm_wake_any_pending_write(in_stack_00000020);
  }
  else {
    local_38 = local_10 + 0x1b;
    local_30 = local_10[0x1f];
    iVar1 = (**(code **)(local_8 + 0x80))(&CMstatic_trans_svcs,local_10[2],&local_38,1,local_18);
    local_40 = (long)iVar1;
    if (local_40 != -1) {
      if (local_40 < local_10[0x1f]) {
        local_10[0x1f] = local_10[0x1f] - local_40;
        memmove(local_10 + 0x1b,(void *)((long)local_10 + local_40 + 0xd8),local_10[0x1f]);
        iVar1 = CMtrace_val[3];
        if (*(long *)(*local_10 + 0x120) == 0) {
          iVar1 = CMtrace_init(in_stack_ffffffffffffff10,trace_type);
        }
        if (iVar1 != 0) {
          if (CMtrace_PID != 0) {
            pFVar5 = *(FILE **)(*local_10 + 0x120);
            _Var2 = getpid();
            lVar3 = (long)_Var2;
            pVar4 = pthread_self();
            fprintf(pFVar5,"P%lxT%lx - ",lVar3,pVar4);
          }
          if (CMtrace_timing != 0) {
            clock_gettime(1,&local_50);
            fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",local_50.tv_sec,local_50.tv_nsec);
          }
          fprintf(*(FILE **)(*local_10 + 0x120),"CMWriteQueuedData, conn %p, remaining header %zd\n"
                  ,local_10,local_10[0x1f]);
        }
        fflush(*(FILE **)(*local_10 + 0x120));
        return;
      }
      goto LAB_0012467f;
    }
LAB_00124def:
    iVar1 = CMtrace_val[7];
    if (*(long *)(*local_10 + 0x120) == 0) {
      iVar1 = CMtrace_init(in_stack_ffffffffffffff10,trace_type);
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        pFVar5 = *(FILE **)(*local_10 + 0x120);
        _Var2 = getpid();
        pVar4 = pthread_self();
        fprintf(pFVar5,"P%lxT%lx - ",(long)_Var2,pVar4);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,&local_d8);
        fprintf(*(FILE **)(*local_10 + 0x120),"%lld.%.9ld - ",local_d8.tv_sec,local_d8.tv_nsec);
      }
      fprintf(*(FILE **)(*local_10 + 0x120),
              "Calling write failed connection failed with dereference %p\n",local_10);
    }
    fflush(*(FILE **)(*local_10 + 0x120));
    INT_CMConnection_failed((CMConnection)in_stack_ffffffffffffff20);
    if (local_10[0x23] != 0) {
      cm_return_data_buf(in_stack_ffffffffffffff20,(CMbuffer)in_stack_ffffffffffffff18);
      local_10[0x23] = 0;
    }
    *(undefined4 *)(local_10 + 0x24) = 0;
    (**(code **)(local_10[1] + 0x90))(local_10[1],&CMstatic_trans_svcs,local_10[2],0);
    cm_wake_any_pending_write(in_stack_00000020);
  }
  return;
}

Assistant:

extern void CMWriteQueuedData(transport_entry trans, CMConnection conn)
 {
     attr_list attrs = NULL;  /* GSE fix */
     CMtrace_out(conn->cm, CMLowLevelVerbose, "CMWriteQueuedData, conn %p, header %zd, attr %zd\n", 
		 conn, conn->queued_data.rem_header_len, 
		 conn->queued_data.rem_attr_len);
     if (conn->queued_data.rem_header_len != 0) {
	 struct FFSEncodeVec tmp_vec[1];
	 ssize_t actual;
	 tmp_vec[0].iov_base = conn->queued_data.rem_header;
	 tmp_vec[0].iov_len = conn->queued_data.rem_header_len;
	 actual = trans->NBwritev_func(&CMstatic_trans_svcs,
					    conn->transport_data,
					    &tmp_vec[0], 1,
					    attrs);
	 if (actual == -1) {
	     goto failed;
	 }
	 if (actual < (ssize_t)conn->queued_data.rem_header_len) {
	     conn->queued_data.rem_header_len -= actual;
	     memmove(&conn->queued_data.rem_header[0],
		     &conn->queued_data.rem_header[actual],
		     conn->queued_data.rem_header_len);
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "CMWriteQueuedData, conn %p, remaining header %zd\n", 
			 conn, conn->queued_data.rem_header_len);
	     return;
	 }
     }
     if (conn->queued_data.rem_attr_len != 0) {
	 struct FFSEncodeVec tmp_vec[1];
	 ssize_t actual;
	 tmp_vec[0].iov_base = conn->queued_data.rem_attr_base;
	 tmp_vec[0].iov_len = conn->queued_data.rem_attr_len;
	 actual = trans->NBwritev_func(&CMstatic_trans_svcs,
					    conn->transport_data,
					    &tmp_vec[0], 1,
					    attrs);
	 if (actual == -1) {
	     goto failed;
	 }
	 if (actual < (ssize_t)conn->queued_data.rem_attr_len) {
	     conn->queued_data.rem_attr_len -= actual;
	     conn->queued_data.rem_attr_base += actual;
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "CMWriteQueuedData, conn %p, remaining attr %zd\n", 
			 conn, conn->queued_data.rem_attr_len);
	     return;
	 }
     }
     if (conn->queued_data.vector_data) {
	 size_t vec_count = 0;
	 size_t length = 0;
	 FFSEncodeVector vec = conn->queued_data.vector_data;
	 ssize_t actual = 0;

	 while(vec[vec_count].iov_base != NULL) {
	     length += vec[vec_count].iov_len;
	     vec_count++;
	 }
	 actual = trans->NBwritev_func(&CMstatic_trans_svcs,
					    conn->transport_data,
					    vec, vec_count,
					    attrs);
	 if (actual == -1) {
	     goto failed;
	 }
	 if (actual < (ssize_t)length) {
	     int i = 0;
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "Continued partial pending write, %zu bytes sent\n", actual);
	     while (actual > (ssize_t)vec[i].iov_len) {
		 actual -= vec[i].iov_len;
		 i++;
		 vec_count--;
	     }
	     vec[i].iov_len -= actual;
	     vec[i].iov_base = (char*)vec[i].iov_base + actual;
	     conn->queued_data.vector_data = &vec[i];
	     CMtrace_out(conn->cm, CMLowLevelVerbose, "CMWriteQueuedData, conn %p, %zu remaining data vectors\n", 
			 conn, vec_count);
	     return;
	 }
     }
     if (conn->queued_data.buffer_to_free) {
	 cm_return_data_buf(conn->cm, conn->queued_data.buffer_to_free);
     }
     conn->write_pending = 0;
     conn->trans->set_write_notify(conn->trans, &CMstatic_trans_svcs, 
				   conn->transport_data, 0);

     if(!CManager_locked(conn->cm)) {
	 printf("Not LOCKED in write queued data!\n");
     }
     cm_wake_any_pending_write(conn);
     return;
  failed:
     CMtrace_out(conn->cm, CMFreeVerbose, "Calling write failed connection failed with dereference %p\n", conn);
     INT_CMConnection_failed(conn);
     if (conn->queued_data.buffer_to_free) {
	 cm_return_data_buf(conn->cm, conn->queued_data.buffer_to_free);
	 conn->queued_data.buffer_to_free = NULL;
     }
     conn->write_pending = 0;
     conn->trans->set_write_notify(conn->trans, &CMstatic_trans_svcs, 
				   conn->transport_data, 0);
     cm_wake_any_pending_write(conn);
     return;
 }